

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall
duckdb::Node::VerifyAllocations
          (Node *this,ART *art,
          unordered_map<unsigned_char,_unsigned_long,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_long>_>_>
          *node_counts)

{
  Node ptr;
  _Elt_pointer pNVar1;
  Node256 *pNVar2;
  Node16 *pNVar3;
  Node48 *pNVar4;
  Node *pNVar5;
  InternalException *this_00;
  Node *pNVar6;
  uint8_t i;
  long lVar7;
  ulong uVar8;
  allocator local_d9;
  ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node> scanner;
  Prefix prefix;
  anon_class_16_2_2c945b07 handler;
  string local_50;
  
  scanner.art = art;
  ::std::
  stack<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::NodeEntry,std::deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::NodeEntry>>>
  ::
  stack<std::deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::NodeEntry>>,void>
            (&scanner.s);
  handler.art = art;
  handler.node_counts = node_counts;
  ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::
  Emplace<duckdb::Node::VerifyAllocations(duckdb::ART&,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>&)const::__0&>
            ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const> *)&scanner,&handler,this);
  do {
    if (scanner.s.c.
        super__Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        scanner.s.c.
        super__Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      ::std::
      _Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry>_>
      ::~_Deque_base((_Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry>_>
                      *)&scanner.s);
      return;
    }
    pNVar1 = scanner.s.c.
             super__Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (scanner.s.c.
        super__Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        scanner.s.c.
        super__Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pNVar1 = scanner.s.c.
               super__Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if (pNVar1[-1].exhausted == true) {
      ::std::
      deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_const_duckdb::Node>::NodeEntry>_>
      ::pop_back(&scanner.s.c);
    }
    else {
      pNVar1[-1].exhausted = true;
      ptr.super_IndexPointer.data = (IndexPointer)((pNVar1[-1].node)->super_IndexPointer).data;
      switch(ptr.super_IndexPointer.data._7_1_ & 0x7f) {
      case PREFIX:
        Prefix::Prefix(&prefix,scanner.art,ptr,true,false);
        ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::
        Emplace<duckdb::Node::VerifyAllocations(duckdb::ART&,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>&)const::__0&>
                  ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const> *)&scanner,&handler,
                   prefix.ptr);
        break;
      case LEAF:
      case LEAF_INLINED:
      case NODE_7_LEAF:
      case NODE_15_LEAF:
      case NODE_256_LEAF:
        break;
      case NODE_4:
        pNVar5 = (Node *)Ref<duckdb::Node4>(scanner.art,ptr,NODE_4);
        pNVar6 = pNVar5;
        for (uVar8 = 0; pNVar6 = pNVar6 + 1, uVar8 < (byte)(pNVar5->super_IndexPointer).data;
            uVar8 = uVar8 + 1) {
          ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::
          Emplace<duckdb::Node::VerifyAllocations(duckdb::ART&,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>&)const::__0&>
                    ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const> *)&scanner,&handler,
                     pNVar6);
        }
        break;
      case NODE_16:
        pNVar3 = Ref<duckdb::Node16>(scanner.art,ptr,NODE_16);
        pNVar6 = (pNVar3->super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>).children;
        for (uVar8 = 0;
            uVar8 < (pNVar3->super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>).count;
            uVar8 = uVar8 + 1) {
          ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::
          Emplace<duckdb::Node::VerifyAllocations(duckdb::ART&,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>&)const::__0&>
                    ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const> *)&scanner,&handler,
                     pNVar6);
          pNVar6 = pNVar6 + 1;
        }
        break;
      case NODE_48:
        pNVar4 = Ref<duckdb::Node48>(scanner.art,ptr,NODE_48);
        for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
          if ((ulong)pNVar4->child_index[lVar7] != 0x30) {
            ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::
            Emplace<duckdb::Node::VerifyAllocations(duckdb::ART&,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>&)const::__0&>
                      ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const> *)&scanner,
                       &handler,pNVar4->children + pNVar4->child_index[lVar7]);
          }
        }
        break;
      case NODE_256:
        pNVar2 = Ref<duckdb::Node256>(scanner.art,ptr,NODE_256);
        for (lVar7 = 0; lVar7 != 0x800; lVar7 = lVar7 + 8) {
          if (*(char *)((long)&pNVar2->children[0].super_IndexPointer.data + lVar7 + 7) != '\0') {
            ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const>::
            Emplace<duckdb::Node::VerifyAllocations(duckdb::ART&,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>&)const::__0&>
                      ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node_const> *)&scanner,
                       &handler,(Node *)((long)&pNVar2->children[0].super_IndexPointer.data + lVar7)
                      );
          }
        }
        break;
      default:
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&prefix,"invalid node type for ART ScanHandleLast: %s",&local_d9);
        EnumUtil::ToString<duckdb::NType>(&local_50,ptr.super_IndexPointer.data._7_1_ & 0x7f);
        InternalException::InternalException<std::__cxx11::string>
                  (this_00,(string *)&prefix,&local_50);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  } while( true );
}

Assistant:

void Node::VerifyAllocations(ART &art, unordered_map<uint8_t, idx_t> &node_counts) const {
	D_ASSERT(HasMetadata());
	ARTScanner<ARTScanHandling::EMPLACE, const Node> scanner(art);

	auto handler = [&art, &node_counts](const Node &node) {
		ARTScanHandlingResult result;
		const auto type = node.GetType();
		switch (type) {
		case NType::LEAF_INLINED:
			return ARTScanHandlingResult::SKIP;
		case NType::LEAF: {
			auto &leaf = Ref<Leaf>(art, node, type);
			leaf.DeprecatedVerifyAllocations(art, node_counts);
			return ARTScanHandlingResult::SKIP;
		}
		case NType::NODE_7_LEAF:
		case NType::NODE_15_LEAF:
		case NType::NODE_256_LEAF: {
			result = ARTScanHandlingResult::SKIP;
			break;
		}
		case NType::PREFIX:
		case NType::NODE_4:
		case NType::NODE_16:
		case NType::NODE_48:
		case NType::NODE_256: {
			result = ARTScanHandlingResult::CONTINUE;
			break;
		}
		default:
			throw InternalException("invalid node type for VerifyAllocations: %s", EnumUtil::ToString(type));
		}
		node_counts[GetAllocatorIdx(type)]++;
		return result;
	};

	scanner.Init(handler, *this);
	scanner.Scan(handler);
}